

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O1

void arkStep_ApplyForcing
               (ARKodeARKStepMem step_mem,sunrealtype *stage_times,sunrealtype *stage_coefs,int jmax
               ,int *nvec)

{
  double dVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  int iVar5;
  sunrealtype *psVar6;
  N_Vector *pp_Var7;
  N_Vector *pp_Var8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  double dVar12;
  
  psVar6 = step_mem->cvals;
  dVar1 = step_mem->tshift;
  dVar2 = step_mem->tscale;
  uVar4 = step_mem->nforcing;
  iVar5 = *nvec;
  if (0 < (long)(int)uVar4) {
    pp_Var7 = step_mem->Xvecs;
    pp_Var8 = step_mem->forcing;
    lVar9 = 0;
    do {
      psVar6[iVar5 + lVar9] = 0.0;
      pp_Var7[iVar5 + lVar9] = pp_Var8[lVar9];
      lVar9 = lVar9 + 1;
    } while ((int)uVar4 != lVar9);
  }
  if (0 < jmax) {
    uVar11 = 0;
    do {
      if (0 < (int)uVar4) {
        dVar3 = stage_times[uVar11];
        uVar10 = 0;
        dVar12 = 1.0;
        do {
          psVar6[(long)iVar5 + uVar10] = dVar12 * stage_coefs[uVar11] + psVar6[(long)iVar5 + uVar10]
          ;
          uVar10 = uVar10 + 1;
          dVar12 = ((dVar3 - dVar1) / dVar2) * dVar12;
        } while (uVar4 != uVar10);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != (uint)jmax);
  }
  *nvec = iVar5 + uVar4;
  return;
}

Assistant:

void arkStep_ApplyForcing(ARKodeARKStepMem step_mem, sunrealtype* stage_times,
                          sunrealtype* stage_coefs, int jmax, int* nvec)
{
  sunrealtype tau, taui;
  int j, k;

  /* Shortcuts to step_mem data */
  sunrealtype* vals  = step_mem->cvals;
  N_Vector* vecs     = step_mem->Xvecs;
  sunrealtype tshift = step_mem->tshift;
  sunrealtype tscale = step_mem->tscale;
  int nforcing       = step_mem->nforcing;
  N_Vector* forcing  = step_mem->forcing;

  /* Offset into vals and vecs arrays */
  int offset = *nvec;

  /* Initialize scaling values, set vectors */
  for (k = 0; k < nforcing; k++)
  {
    vals[offset + k] = ZERO;
    vecs[offset + k] = forcing[k];
  }

  for (j = 0; j < jmax; j++)
  {
    tau  = (stage_times[j] - tshift) / tscale;
    taui = ONE;

    for (k = 0; k < nforcing; k++)
    {
      vals[offset + k] += stage_coefs[j] * taui;
      taui *= tau;
    }
  }

  /* Update vector count for linear combination */
  *nvec += nforcing;
}